

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O0

void __thiscall
UnifiedRegex::Inst::PrintBytes<UnifiedRegex::SwitchMixin<(unsigned_char)4>>
          (Inst *this,DebugWriter *w,Inst *inst,SwitchMixin<(unsigned_char)__x04_> *that,
          char16 *annotation)

{
  SwitchMixin<(unsigned_char)__x04_> *local_68;
  byte *currentByte;
  byte *endByte;
  size_t size;
  ptrdiff_t offset;
  byte *baseByte;
  byte *startByte;
  SwitchMixin<(unsigned_char)__x04_> *start;
  char16 *annotation_local;
  SwitchMixin<(unsigned_char)__x04_> *that_local;
  Inst *inst_local;
  DebugWriter *w_local;
  Inst *this_local;
  
  DebugWriter::Print(w,L"0x%p[+0x%03x](0x%03x) [%s]:",that,(long)that - (long)inst,0x19,annotation);
  for (local_68 = that; local_68 < that + 1;
      local_68 = (SwitchMixin<(unsigned_char)__x04_> *)local_68->cases) {
    if (((long)local_68 - (long)(that + 1)) % 4 == 0) {
      DebugWriter::Print(w,L" ",(ulong)local_68->numCases);
    }
    DebugWriter::Print(w,L"%02x",(ulong)local_68->numCases);
  }
  DebugWriter::PrintEOL(w,L"");
  return;
}

Assistant:

void Inst::PrintBytes(DebugWriter *w, Inst *inst, T *that, const char16 *annotation) const
    {
        T *start = (T*)that;
        byte *startByte = (byte *)start;
        byte *baseByte = (byte *)inst;
        ptrdiff_t offset = startByte - baseByte;
        size_t size = sizeof(*((T *)that));
        byte *endByte = startByte + size;
        byte *currentByte = startByte;
        w->Print(_u("0x%p[+0x%03x](0x%03x) [%s]:"), startByte, offset, size, annotation);

        for (; currentByte < endByte; ++currentByte)
        {
            if ((currentByte - endByte) % 4 == 0)
            {
                w->Print(_u(" "), *currentByte);
            }
            w->Print(_u("%02x"), *currentByte);
        }
        w->PrintEOL(_u(""));
    }